

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByNumber
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  pthread_mutex_t *__mutex;
  Tables *pTVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  MutexLockMaybe lock;
  MutexLockMaybe local_40;
  key_type local_38;
  
  if (*(int *)(extendee + 0x78) == 0) {
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    __mutex = (pthread_mutex_t *)this->mutex_;
    if (__mutex != (pthread_mutex_t *)0x0) {
      iVar3 = pthread_mutex_lock(__mutex);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      pTVar1 = (this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
               _M_head_impl;
      local_38.first = extendee;
      local_38.second = number;
      cVar4 = std::
              _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
              ::find(&(pTVar1->extensions_)._M_t,&local_38);
      if (cVar4._M_node == (_Base_ptr)((long)&(pTVar1->extensions_)._M_t + 8U)) {
        pthread_mutex_unlock(__mutex);
      }
      else {
        p_Var5 = cVar4._M_node[1]._M_left;
        pthread_mutex_unlock(__mutex);
        if (p_Var5 != (_Base_ptr)0x0) {
          return (FieldDescriptor *)p_Var5;
        }
      }
    }
    internal::MutexLockMaybe::MutexLockMaybe(&local_40,this->mutex_);
    if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(((this->tables_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                _M_head_impl)->known_bad_symbols_)._M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(((this->tables_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                _M_head_impl)->known_bad_files_)._M_h);
    }
    pTVar1 = (this->tables_)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
    local_38.first = extendee;
    local_38.second = number;
    cVar4 = std::
            _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::find(&(pTVar1->extensions_)._M_t,&local_38);
    if ((((cVar4._M_node == (_Base_ptr)((long)&(pTVar1->extensions_)._M_t + 8U)) ||
         (p_Var5 = cVar4._M_node[1]._M_left, p_Var5 == (_Base_ptr)0x0)) &&
        ((this->underlay_ == (DescriptorPool *)0x0 ||
         (p_Var5 = (_Base_ptr)FindExtensionByNumber(this->underlay_,extendee,number),
         p_Var5 == (_Base_ptr)0x0)))) &&
       (((bVar2 = TryFindExtensionInFallbackDatabase(this,extendee,number), !bVar2 ||
         (pTVar1 = (this->tables_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl, local_38.first = extendee, local_38.second = number,
         cVar4 = std::
                 _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                 ::find(&(pTVar1->extensions_)._M_t,&local_38),
         cVar4._M_node == (_Base_ptr)((long)&(pTVar1->extensions_)._M_t + 8U))) ||
        (p_Var5 = cVar4._M_node[1]._M_left, p_Var5 == (_Base_ptr)0x0)))) {
      p_Var5 = (_Base_ptr)0x0;
    }
    if ((pthread_mutex_t *)local_40.mu_ != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)local_40.mu_);
    }
  }
  return (FieldDescriptor *)p_Var5;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByNumber(
    const Descriptor* extendee, int number) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  // A faster path to reduce lock contention in finding extensions, assuming
  // most extensions will be cache hit.
  if (mutex_ != nullptr) {
    ReaderMutexLock lock(mutex_);
    const FieldDescriptor* result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
  }
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != nullptr) {
    return result;
  }
  if (underlay_ != nullptr) {
    result = underlay_->FindExtensionByNumber(extendee, number);
    if (result != nullptr) return result;
  }
  if (TryFindExtensionInFallbackDatabase(extendee, number)) {
    result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
  }
  return nullptr;
}